

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeTransform::TransferToAttribute(AttributeTransform *this,PointAttribute *attribute)

{
  __uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
  this_00;
  pointer __p;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  transform_data;
  __uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  local_28;
  
  this_00.
  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
       (__uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
        )operator_new(0x30);
  AttributeTransformData::AttributeTransformData
            ((AttributeTransformData *)
             this_00.
             super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
             .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl);
  transform_data._M_t.
  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
        )(__uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
           .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl;
  (*this->_vptr_AttributeTransform[4])
            (this,this_00.
                  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
                  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl);
  transform_data._M_t.
  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
        )(__uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
          )0x0;
  local_28._M_t.
  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
       (tuple<draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>)
       (_Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
        )0x0;
  std::
  __uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  ::reset((__uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
           *)&attribute->attribute_transform_data_,
          (pointer)this_00.
                   super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
                   .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl);
  std::
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>::
  ~unique_ptr((unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
               *)&local_28);
  std::
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>::
  ~unique_ptr(&transform_data);
  return true;
}

Assistant:

bool AttributeTransform::TransferToAttribute(PointAttribute *attribute) const {
  std::unique_ptr<AttributeTransformData> transform_data(
      new AttributeTransformData());
  this->CopyToAttributeTransformData(transform_data.get());
  attribute->SetAttributeTransformData(std::move(transform_data));
  return true;
}